

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O1

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>::
addRegistration<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IRunner>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird> *this,
          shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
          *instanceStorage)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  *this_01;
  shared_ptr<cinject::IInstanceRetriever> local_80;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  lVar1 = *(long *)this;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50 = (undefined1  [8])&IRunner::typeinfo;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_70,local_70 + local_68);
  this_01 = (vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
             *)std::__detail::
               _Map_base<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(lVar1 + 8),(key_type *)local_50);
  local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x18);
  peVar2 = (instanceStorage->
           super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  this_00 = (instanceStorage->
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_InstanceRetriever<IRunner>).super_IInstanceRetriever._vptr_IInstanceRetriever =
         (_func_int **)&PTR__CastInstanceRetriever_001473b0;
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->storage_).
    super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->storage_).
    super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_InstanceRetriever<IRunner>).super_IInstanceRetriever._vptr_IInstanceRetriever =
         (_func_int **)&PTR__CastInstanceRetriever_001473b0;
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->storage_).
    super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    (((CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
       *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->storage_).
    super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cinject::CastInstanceRetriever<Bird,IRunner,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>>*>
            (&local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
              *)local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr);
  std::
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  ::emplace_back<std::shared_ptr<cinject::IInstanceRetriever>>(this_01,&local_80);
  if (local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void addRegistration(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        static_assert(std::is_convertible<TImplementation*, TComponent*>::value, "No conversion exists from TImplementation* to TComponent*");

        container_->registrations_[make_component_type<TComponent>()]
            .emplace_back(std::shared_ptr<IInstanceRetriever>(new CastInstanceRetriever<TImplementation, TComponent, TInstanceStorage>(instanceStorage)));
    }